

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogramovserver.cpp
# Opt level: O0

void __thiscall HistogramOvserver::onNotified(HistogramOvserver *this)

{
  int iVar1;
  int iVar2;
  int local_18;
  int local_14;
  int data;
  int i;
  HistogramOvserver *this_local;
  
  local_14 = 0;
  _data = this;
  while( true ) {
    iVar1 = local_14;
    iVar2 = DataTable::count((this->super_DataTableObserver)._table);
    if (iVar2 <= iVar1) break;
    DataTable::get((this->super_DataTableObserver)._table,local_14,&local_18);
    printData(this,local_18,local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void HistogramOvserver::onNotified()
{
	for (int i = 0; i < _table->count(); ++i) {
		int data;
		_table->get(i, &data);
		printData(data, i);
	}
}